

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O1

void __thiscall QGridLayoutPrivate::deleteAll(QGridLayoutPrivate *this)

{
  QGridBox ***pppQVar1;
  qsizetype *pqVar2;
  QGridBox *pQVar3;
  QList<QLayoutStruct> *pQVar4;
  Data *pDVar5;
  iterator iVar6;
  
  if ((this->things).d.size != 0) {
    do {
      iVar6 = QList<QGridBox_*>::begin(&this->things);
      pQVar3 = *iVar6.i;
      pppQVar1 = &(this->things).d.ptr;
      *pppQVar1 = *pppQVar1 + 1;
      pqVar2 = &(this->things).d.size;
      *pqVar2 = *pqVar2 + -1;
      if (pQVar3 != (QGridBox *)0x0) {
        if (pQVar3->item_ != (QLayoutItem *)0x0) {
          (*pQVar3->item_->_vptr_QLayoutItem[1])();
        }
        operator_delete(pQVar3,0x18);
      }
    } while ((this->things).d.size != 0);
  }
  pQVar4 = this->hfwData;
  if (pQVar4 != (QList<QLayoutStruct> *)0x0) {
    pDVar5 = (pQVar4->d).d;
    if (pDVar5 != (Data *)0x0) {
      LOCK();
      (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&((pQVar4->d).d)->super_QArrayData,0x20,0x10);
      }
    }
    operator_delete(pQVar4,0x18);
    return;
  }
  return;
}

Assistant:

void QGridLayoutPrivate::deleteAll()
{
    while (!things.isEmpty())
        delete things.takeFirst();
    delete hfwData;
}